

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes256.c
# Opt level: O1

int aead_aes256gcm_setup_crypto(ptls_aead_context_t *ctx,int is_enc,void *key)

{
  int iVar1;
  EVP_CIPHER *cipher;
  
  cipher = EVP_aes_256_gcm();
  iVar1 = aead_setup_crypto(ctx,is_enc,key,(EVP_CIPHER *)cipher);
  return iVar1;
}

Assistant:

static int aead_aes256gcm_setup_crypto(ptls_aead_context_t *ctx, int is_enc, const void *key)
{
    return aead_aesgcm_setup_crypto(ctx, is_enc, key, PTLS_AES256_KEY_SIZE);
}